

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestAllTypesLite_NestedMessage::~TestAllTypesLite_NestedMessage
          (TestAllTypesLite_NestedMessage *this)

{
  ~TestAllTypesLite_NestedMessage(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TestAllTypesLite_NestedMessage::~TestAllTypesLite_NestedMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestAllTypesLite.NestedMessage)
  SharedDtor(*this);
}